

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bijectionmap.h
# Opt level: O2

size_t __thiscall
Common::SerialBijectionMap<ICM::Object_*>::_insert
          (SerialBijectionMap<ICM::Object_*> *this,Object **key)

{
  mapped_type *pmVar1;
  mapped_type mVar2;
  
  pmVar1 = (this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur == pmVar1) {
    mVar2 = this->currcount;
    pmVar1 = std::
             map<ICM::Object_*,_unsigned_long,_std::less<ICM::Object_*>,_std::allocator<std::pair<ICM::Object_*const,_unsigned_long>_>_>
             ::operator[](&this->keymap,key);
    *pmVar1 = mVar2;
    std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::push_back(&this->data,key);
    mVar2 = this->currcount;
    this->currcount = mVar2 + 1;
  }
  else {
    mVar2 = *pmVar1;
    pmVar1 = std::
             map<ICM::Object_*,_unsigned_long,_std::less<ICM::Object_*>,_std::allocator<std::pair<ICM::Object_*const,_unsigned_long>_>_>
             ::operator[](&this->keymap,key);
    *pmVar1 = mVar2;
    (this->data).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
    super__Vector_impl_data._M_start[mVar2] = *key;
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&this->destroyable);
  }
  return mVar2;
}

Assistant:

size_t _insert(const _KTy &key) {
		if (destroyable.empty()) {
			keymap[key] = currcount;
			data.push_back(key);
			currcount++;
			return currcount - 1;
		}
		else {
			size_t id = destroyable.front();
			keymap[key] = id;
			data[id] = key;
			destroyable.pop_front();
			return id;
		}
	}